

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DesignatorPdu.cpp
# Opt level: O3

void __thiscall DIS::DesignatorPdu::marshal(DesignatorPdu *this,DataStream *dataStream)

{
  DistributedEmissionsFamilyPdu::marshal(&this->super_DistributedEmissionsFamilyPdu,dataStream);
  EntityID::marshal(&this->_designatingEntityID,dataStream);
  DataStream::operator<<(dataStream,this->_codeName);
  EntityID::marshal(&this->_designatedEntityID,dataStream);
  DataStream::operator<<(dataStream,this->_designatorCode);
  DataStream::operator<<(dataStream,this->_designatorPower);
  DataStream::operator<<(dataStream,this->_designatorWavelength);
  Vector3Float::marshal(&this->_designatorSpotWrtDesignated,dataStream);
  Vector3Double::marshal(&this->_designatorSpotLocation,dataStream);
  DataStream::operator<<(dataStream,this->_deadReckoningAlgorithm);
  DataStream::operator<<(dataStream,this->_padding1);
  DataStream::operator<<(dataStream,this->_padding2);
  Vector3Float::marshal(&this->_entityLinearAcceleration,dataStream);
  return;
}

Assistant:

void DesignatorPdu::marshal(DataStream& dataStream) const
{
    DistributedEmissionsFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _designatingEntityID.marshal(dataStream);
    dataStream << _codeName;
    _designatedEntityID.marshal(dataStream);
    dataStream << _designatorCode;
    dataStream << _designatorPower;
    dataStream << _designatorWavelength;
    _designatorSpotWrtDesignated.marshal(dataStream);
    _designatorSpotLocation.marshal(dataStream);
    dataStream << _deadReckoningAlgorithm;
    dataStream << _padding1;
    dataStream << _padding2;
    _entityLinearAcceleration.marshal(dataStream);
}